

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

void llama_sampler_chain_free(llama_sampler *smpl)

{
  void *pvVar1;
  undefined8 *puVar2;
  long *plVar3;
  void *pvVar4;
  undefined8 *puVar5;
  
  pvVar1 = smpl->ctx;
  puVar2 = *(undefined8 **)((long)pvVar1 + 0x10);
  for (puVar5 = *(undefined8 **)((long)pvVar1 + 8); puVar5 != puVar2; puVar5 = puVar5 + 1) {
    plVar3 = (long *)*puVar5;
    if (plVar3 != (long *)0x0) {
      if (*(code **)(*plVar3 + 0x28) != (code *)0x0) {
        (**(code **)(*plVar3 + 0x28))(plVar3);
      }
      operator_delete(plVar3,0x10);
    }
  }
  if (pvVar1 != (void *)0x0) {
    pvVar4 = *(void **)((long)pvVar1 + 8);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,*(long *)((long)pvVar1 + 0x18) - (long)pvVar4);
    }
    operator_delete(pvVar1,0x30);
    return;
  }
  return;
}

Assistant:

static void llama_sampler_chain_free(struct llama_sampler * smpl) {
    auto * chain = (llama_sampler_chain *) smpl->ctx;

    for (auto * smpl : chain->samplers) {
        llama_sampler_free(smpl);
    }

    delete chain;
}